

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::Sweep(SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
        *this,RecyclerSweep *recyclerSweep)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  anon_class_8_1_b8cf05bd fn;
  undefined8 *in_FS_OFFSET;
  
  fn.recycler = RecyclerSweep::GetRecycler(recyclerSweep);
  bVar3 = RecyclerSweep::InPartialCollect(recyclerSweep);
  if ((!bVar3) &&
     (this->partialHeapBlockList !=
      (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,800,"(recyclerSweep.InPartialCollect() || partialHeapBlockList == nullptr)",
                       "recyclerSweep.InPartialCollect() || partialHeapBlockList == nullptr");
    if (!bVar3) goto LAB_002a4fc4;
    *puVar1 = 0;
  }
  bVar3 = RecyclerSweep::InPartialCollect(recyclerSweep);
  if ((!bVar3) &&
     (this->partialSweptHeapBlockList !=
      (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x322,
                       "(recyclerSweep.InPartialCollect() || partialSweptHeapBlockList == nullptr)",
                       "recyclerSweep.InPartialCollect() || partialSweptHeapBlockList == nullptr");
    if (!bVar3) {
LAB_002a4fc4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::SweepVerifyPartialBlocks(Memory::Recycler*,Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->partialHeapBlockList,
             (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,fn);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::
  SweepBucket<Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::Sweep(Memory::RecyclerSweep&)::_lambda(Memory::RecyclerSweep&)_1_>
            ((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
              *)this,recyclerSweep);
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::Sweep(RecyclerSweep& recyclerSweep)
{
#if ENABLE_PARTIAL_GC
#if DBG
    Recycler * recycler = recyclerSweep.GetRecycler();
    // Don't need sweep the partialHeapBlockList, the partially collected heap block list.
    // There should be nothing there that is free-able since the last time we swept

    Assert(recyclerSweep.InPartialCollect() || partialHeapBlockList == nullptr);
#if ENABLE_CONCURRENT_GC
    Assert(recyclerSweep.InPartialCollect() || partialSweptHeapBlockList == nullptr);
#endif
    this->SweepVerifyPartialBlocks(recycler, this->partialHeapBlockList);
#endif
#endif

    BaseT::SweepBucket(recyclerSweep, [](RecyclerSweep& recyclerSweep){});
}